

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

string * __thiscall
pybind11::detail::replace_newlines_and_squash_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *text)

{
  ulong uVar1;
  char *pcVar2;
  size_t str_range;
  size_t str_end;
  long local_68;
  size_t str_begin;
  char local_57;
  char local_56;
  byte local_55;
  char last_char;
  char first_char;
  bool previous_is_whitespace;
  allocator<char> local_41;
  string local_40 [8];
  string result;
  char *whitespaces;
  char *text_local;
  
  result.field_2._8_8_ = anon_var_dwarf_783f4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,(char *)this,&local_41);
  std::allocator<char>::~allocator(&local_41);
  local_55 = 0;
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    local_56 = *pcVar2;
    std::__cxx11::string::size();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    local_57 = *pcVar2;
    if ((local_56 == local_57) && (local_56 == '\'')) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,local_40);
      goto LAB_001cbfb5;
    }
  }
  std::__cxx11::string::clear();
  for (whitespaces = (char *)this; *whitespaces != '\0'; whitespaces = whitespaces + 1) {
    pcVar2 = strchr((char *)result.field_2._8_8_,(int)*whitespaces);
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator+=(local_40,*whitespaces);
      local_55 = 0;
    }
    else if ((local_55 & 1) == 0) {
      std::__cxx11::string::operator+=(local_40,' ');
      local_55 = 1;
    }
  }
  local_68 = std::__cxx11::string::find_first_not_of((char *)local_40,result.field_2._8_8_);
  if (local_68 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)((long)&str_end + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&str_end + 7));
  }
  else {
    std::__cxx11::string::find_last_not_of((char *)local_40,result.field_2._8_8_);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_40);
  }
LAB_001cbfb5:
  str_begin._4_4_ = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

inline std::string replace_newlines_and_squash(const char *text) {
    const char *whitespaces = " \t\n\r\f\v";
    std::string result(text);
    bool previous_is_whitespace = false;

    if (result.size() >= 2) {
        // Do not modify string representations
        char first_char = result[0];
        char last_char = result[result.size() - 1];
        if (first_char == last_char && first_char == '\'') {
            return result;
        }
    }
    result.clear();

    // Replace characters in whitespaces array with spaces and squash consecutive spaces
    while (*text != '\0') {
        if (std::strchr(whitespaces, *text)) {
            if (!previous_is_whitespace) {
                result += ' ';
                previous_is_whitespace = true;
            }
        } else {
            result += *text;
            previous_is_whitespace = false;
        }
        ++text;
    }

    // Strip leading and trailing whitespaces
    const size_t str_begin = result.find_first_not_of(whitespaces);
    if (str_begin == std::string::npos) {
        return "";
    }

    const size_t str_end = result.find_last_not_of(whitespaces);
    const size_t str_range = str_end - str_begin + 1;

    return result.substr(str_begin, str_range);
}